

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_compute_blob.h
# Opt level: O2

float __thiscall
ncnn::compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
          (compute_coord<(ncnn::GridSample::PaddingMode)3,_false> *this,int length,float coord)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = (float)length;
  fVar2 = (fVar3 - ABS(ABS(coord + 0.5) - fVar3)) + -0.5;
  fVar1 = 0.0;
  if (0.0 <= fVar2) {
    fVar1 = fVar2;
  }
  if (fVar3 + -1.0 <= fVar1) {
    fVar1 = fVar3 + -1.0;
  }
  return fVar1;
}

Assistant:

float operator()(int length, float coord)
    {
        coord = fabs(coord + 0.5f);
        coord = length - fabs(coord - length) - 0.5;

        return std::min(length - 1.0f, std::max(coord, 0.0f));
    }